

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SerialArenaChunk *
google::protobuf::internal::ThreadSafeArena::NewSerialArenaChunk
          (uint32_t prev_capacity,void *id,SerialArena *serial)

{
  uint uVar1;
  ulong uVar2;
  void *pvVar3;
  Nonnull<const_char_*> pcVar4;
  unsigned_long v1;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  
  uVar2 = ((ulong)prev_capacity * 0x10 + 0x10) * 4;
  if (0xfff < uVar2) {
    uVar2 = 0x1000;
  }
  uVar1 = (int)uVar2 - 0x10U >> 4;
  uVar2 = (ulong)(uVar1 * 8 + 0x10) + (ulong)(uVar1 * 8);
  if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
    pvVar3 = operator_new(uVar2);
    auVar5._8_8_ = uVar2;
    auVar5._0_8_ = pvVar3;
  }
  else {
    auVar5 = (**(code **)(in_FS_OFFSET + -0x48))(uVar2,*(undefined8 *)(in_FS_OFFSET + -0x40));
  }
  uVar1 = auVar5._8_4_ - 0x10U >> 4;
  v1 = (ulong)(uVar1 * 8 + 0x10) + (ulong)(uVar1 * 8);
  if (auVar5._8_8_ < v1) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,auVar5._8_8_,"SerialArenaChunk::AllocSize(next_capacity) <= mem.n");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    SerialArenaChunk::SerialArenaChunk(auVar5._0_8_,uVar1,id,serial);
    return auVar5._0_8_;
  }
  NewSerialArenaChunk();
}

Assistant:

ThreadSafeArena::SerialArenaChunk* ThreadSafeArena::NewSerialArenaChunk(
    uint32_t prev_capacity, void* id, SerialArena* serial) {
  constexpr size_t kMaxBytes = 4096;  // Can hold up to 255 entries.
  constexpr size_t kGrowthFactor = 4;
  constexpr size_t kHeaderSize = SerialArenaChunk::AllocSize(0);
  constexpr size_t kEntrySize = SerialArenaChunk::AllocSize(1) - kHeaderSize;

  // On x64 arch: {4, 16, 64, 256, 256, ...} * 16.
  size_t prev_bytes = SerialArenaChunk::AllocSize(prev_capacity);
  size_t next_bytes = std::min(kMaxBytes, prev_bytes * kGrowthFactor);
  uint32_t next_capacity =
      static_cast<uint32_t>(next_bytes - kHeaderSize) / kEntrySize;
  // Growth based on bytes needs to be adjusted by AllocSize.
  next_bytes = SerialArenaChunk::AllocSize(next_capacity);

  // If we allocate bigger memory than requested, we should expand
  // size to use that extra space, and add extra entries permitted
  // by the extra space.
  SizedPtr mem = AllocateAtLeast(next_bytes);
  next_capacity = static_cast<uint32_t>(mem.n - kHeaderSize) / kEntrySize;
  ABSL_DCHECK_LE(SerialArenaChunk::AllocSize(next_capacity), mem.n);
  return new (mem.p) SerialArenaChunk{next_capacity, id, serial};
}